

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadExtend
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  uint uVar1;
  array<wasm::Literal,_8UL> local_338;
  array<wasm::Literal,_4UL> local_278;
  undefined1 auStack_218 [8];
  array<wasm::Literal,_2UL> lanes;
  undefined1 local_158 [8];
  Flow flow;
  SIMDLoad *local_e0;
  Address memorySize;
  Type addressType;
  MemoryInstanceInfo info;
  Literal local_a0;
  Literal local_88;
  Type local_70;
  anon_class_16_2_3ef7c955 loadLane;
  anon_class_48_6_a8494b4f fillLanes;
  Address src;
  SIMDLoad *curr_local;
  
  src.addr = (address64_t)curr;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_158,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    Flow::getSingleValue((Flow *)local_158);
    fillLanes.memorySize = (Address *)::wasm::Literal::getUnsigned();
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)&addressType,this,(Name)((IString *)(src.addr + 0x30))->str);
    local_70.id = (uintptr_t)&src;
    loadLane.curr = (SIMDLoad **)&addressType;
    local_e0 = (SIMDLoad *)
               getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)addressType.id,
                             (Name)info._0_16_);
    fillLanes.curr = &local_e0;
    memorySize.addr = *(address64_t *)(*(long *)(src.addr + 0x28) + 8);
    fillLanes.src = &memorySize;
    loadLane.info = (MemoryInstanceInfo *)&fillLanes.memorySize;
    fillLanes.addressType = &local_70;
    uVar1 = *(uint *)(src.addr + 0x10);
    fillLanes.loadLane = (anon_class_16_2_3ef7c955 *)&addressType;
    fillLanes.info = (MemoryInstanceInfo *)&src;
    if (9 < uVar1) {
LAB_001d0e58:
      ::wasm::handle_unreachable
                ("unexpected op",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xf33);
    }
    if ((0x30U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x300U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001d0e58;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_218 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        std::array<wasm::Literal,_2UL>::array
                  ((array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str,
                   (array<wasm::Literal,_2UL> *)auStack_218);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_88,&loadLane.info,
                   (array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str,4);
        Flow::Flow(__return_storage_ptr__,&local_88);
        ::wasm::Literal::~Literal(&local_88);
        std::array<wasm::Literal,_2UL>::~array
                  ((array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str);
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)auStack_218);
      }
      else {
        lanes._M_elems[1].type.id = 0;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_218 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        std::array<wasm::Literal,_4UL>::array(&local_278,(array<wasm::Literal,_4UL> *)auStack_218);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_a0,&loadLane.info,&local_278,2);
        Flow::Flow(__return_storage_ptr__,&local_a0);
        ::wasm::Literal::~Literal(&local_a0);
        std::array<wasm::Literal,_4UL>::~array(&local_278);
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)auStack_218);
      }
    }
    else {
      memset((array<wasm::Literal,_8UL> *)auStack_218,0,0xc0);
      std::array<wasm::Literal,_8UL>::array(&local_338,(array<wasm::Literal,_8UL> *)auStack_218);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                ((Literal *)&info.name.super_IString.str._M_str,&loadLane.info,&local_338,1);
      Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      std::array<wasm::Literal,_8UL>::~array(&local_338);
      std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)auStack_218);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadExtend(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    Address src(flow.getSingleValue().getUnsigned());
    auto info = getMemoryInstanceInfo(curr->memory);
    auto loadLane = [&](Address addr) {
      switch (curr->op) {
        case Load8x8SVec128:
          return Literal(int32_t(info.interface()->load8s(addr, info.name)));
        case Load8x8UVec128:
          return Literal(int32_t(info.interface()->load8u(addr, info.name)));
        case Load16x4SVec128:
          return Literal(int32_t(info.interface()->load16s(addr, info.name)));
        case Load16x4UVec128:
          return Literal(int32_t(info.interface()->load16u(addr, info.name)));
        case Load32x2SVec128:
          return Literal(int64_t(info.interface()->load32s(addr, info.name)));
        case Load32x2UVec128:
          return Literal(int64_t(info.interface()->load32u(addr, info.name)));
        default:
          WASM_UNREACHABLE("unexpected op");
      }
      WASM_UNREACHABLE("invalid op");
    };
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addressType = curr->ptr->type;
    auto fillLanes = [&](auto lanes, size_t laneBytes) {
      for (auto& lane : lanes) {
        auto ptr = Literal::makeFromInt64(src, addressType);
        lane = loadLane(
          info.instance->getFinalAddress(curr, ptr, laneBytes, memorySize));
        src =
          ptr.add(Literal::makeFromInt32(laneBytes, addressType)).getUnsigned();
      }
      return Literal(lanes);
    };
    switch (curr->op) {
      case Load8x8SVec128:
      case Load8x8UVec128: {
        std::array<Literal, 8> lanes;
        return fillLanes(lanes, 1);
      }
      case Load16x4SVec128:
      case Load16x4UVec128: {
        std::array<Literal, 4> lanes;
        return fillLanes(lanes, 2);
      }
      case Load32x2SVec128:
      case Load32x2UVec128: {
        std::array<Literal, 2> lanes;
        return fillLanes(lanes, 4);
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    WASM_UNREACHABLE("invalid op");
  }